

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

TestVat * __thiscall capnp::_::anon_unknown_0::TestNetwork::add(TestNetwork *this,StringPtr name)

{
  Array<kj::_::HashBucket> *this_00;
  size_t *psVar1;
  uint uVar2;
  Entry *pEVar3;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
  *this_01;
  bool bVar4;
  uint uVar5;
  TestVat *pTVar6;
  Iface *pIVar7;
  long lVar8;
  Entry *pEVar9;
  HashBucket *pHVar10;
  size_t sVar11;
  long lVar12;
  Entry *pEVar13;
  char *pcVar14;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar15;
  size_t in_R8;
  Entry *pEVar16;
  uint uVar17;
  size_t sVar18;
  ulong capacity;
  HashBucket *_s944;
  HashBucket *pHVar19;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
  local_98;
  ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
  *local_70;
  long local_68;
  Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t> local_60;
  ArrayPtr<const_char> local_50;
  Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t> local_40;
  
  sVar11 = name.content.size_;
  pcVar14 = name.content.ptr;
  pTVar6 = (TestVat *)operator_new(0x290);
  (pTVar6->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
       (_func_int **)&PTR_baseConnect_0064fa48;
  pTVar6->network = this;
  (pTVar6->self).content.ptr = pcVar14;
  (pTVar6->self).content.size_ = sVar11;
  (pTVar6->connections).table.rows.builder.endPtr = (Entry *)0x0;
  (pTVar6->connections).table.rows.builder.ptr = (Entry *)0x0;
  (pTVar6->connections).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
        *)0x0;
  pTVar6->sent = 0;
  pTVar6->received = 0;
  (pTVar6->shutdownExceptionToThrow).ptr.isSet = false;
  (pTVar6->connections).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pTVar6->connections).table.indexes.erasedCount = 0;
  (pTVar6->connections).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pTVar6->connections).table.indexes.buckets.size_ = 0;
  (pTVar6->connections).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (pTVar6->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pTVar6->acceptQueue;
  (pTVar6->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pTVar6->acceptQueue;
  (pTVar6->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node._M_size = 0;
  (pTVar6->acceptQueue).waiters.queue.head.ptr = (BaseNode *)0x0;
  (pTVar6->acceptQueue).waiters.queue.tail =
       (Maybe<kj::WaiterQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>::BaseNode_&>
        *)&(pTVar6->acceptQueue).waiters;
  (pTVar6->acceptQueue).waiters.queue.listSize = 0;
  pIVar7 = (Iface *)operator_new(0x10);
  pIVar7->_vptr_Iface = (_func_int **)&PTR_operator___0064fa90;
  (pTVar6->sendCallback).impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<bool(capnp::MessageBuilder&)>::Impl<capnp::_::(anonymous_namespace)::TestVat::sendCallback::{lambda(capnp::MessageBuilder&)#1}>>
        ::instance;
  (pTVar6->sendCallback).impl.ptr = pIVar7;
  (pTVar6->tphExchanges).table.rows.builder.ptr = (Entry *)0x0;
  (pTVar6->tphExchanges).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
        *)0x0;
  (pTVar6->tphExchanges).table.rows.builder.endPtr = (Entry *)0x0;
  (pTVar6->tphExchanges).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pTVar6->tphExchanges).table.indexes.erasedCount = 0;
  (pTVar6->tphExchanges).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pTVar6->tphExchanges).table.indexes.buckets.size_ = 0;
  (pTVar6->tphExchanges).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  local_60.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::instance;
  local_40.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::instance;
  local_60.ptr = (TestVat *)0x0;
  pEVar9 = (this->map).table.rows.builder.ptr;
  lVar12 = (long)(this->map).table.rows.builder.pos - (long)pEVar9;
  lVar8 = lVar12 >> 5;
  this_00 = &(this->map).table.indexes.buckets;
  pHVar19 = (HashBucket *)(this->map).table.indexes.buckets.size_;
  local_50.ptr = pcVar14;
  local_50.size_ = sVar11;
  local_40.ptr = pTVar6;
  if ((ulong)((long)pHVar19 * 2) < ((this->map).table.indexes.erasedCount + lVar8) * 3 + 3) {
    oldBuckets.size_ = lVar8 * 3 + 3;
    oldBuckets.ptr = pHVar19;
    kj::_::rehash((Array<kj::_::HashBucket> *)&local_98,(_ *)this_00->ptr,oldBuckets,in_R8);
    kj::Array<kj::_::HashBucket>::operator=(this_00,(Array<kj::_::HashBucket> *)&local_98);
    kj::Array<kj::_::HashBucket>::~Array((Array<kj::_::HashBucket> *)&local_98);
    (this->map).table.indexes.erasedCount = 0;
  }
  uVar5 = kj::hashCode<kj::StringPtr&>((StringPtr *)&local_50);
  local_70 = (ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
              *)&this->map;
  sVar11 = (this->map).table.indexes.buckets.size_;
  uVar17 = (int)sVar11 - 1U & uVar5;
  pHVar19 = (HashBucket *)0x0;
  local_68 = lVar12;
  do {
    this_01 = local_70;
    pHVar10 = this_00->ptr + uVar17;
    uVar2 = pHVar10->value;
    if (uVar2 == 1) {
      if (pHVar19 == (HashBucket *)0x0) {
        pHVar19 = pHVar10;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar19 != (HashBucket *)0x0) {
          psVar1 = &(this->map).table.indexes.erasedCount;
          *psVar1 = *psVar1 - 1;
          pHVar10 = pHVar19;
        }
        *pHVar10 = (HashBucket)((ulong)uVar5 + local_68 * 0x8000000 + 0x200000000);
        pRVar15 = (this->map).table.rows.builder.pos;
        if (pRVar15 == (this->map).table.rows.builder.endPtr) {
          pEVar9 = local_70->ptr;
          capacity = 4;
          if ((long)pRVar15 - (long)pEVar9 != 0) {
            capacity = (long)pRVar15 - (long)pEVar9 >> 4;
          }
          if (capacity < (ulong)((long)pRVar15 - (long)pEVar9 >> 5)) {
            while (pEVar9 + capacity < pRVar15) {
              (this->map).table.rows.builder.pos = pRVar15 + -1;
              kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>::~Own
                        (&pRVar15[-1].value);
              pRVar15 = (this->map).table.rows.builder.pos;
            }
          }
          local_98.ptr = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                            (0x20,0,capacity,(_func_void_void_ptr *)0x0,
                                             (_func_void_void_ptr *)0x0);
          local_98.endPtr = local_98.ptr + capacity;
          local_98.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          pEVar3 = (this->map).table.rows.builder.pos;
          pEVar16 = local_98.ptr;
          for (pEVar9 = (this->map).table.rows.builder.ptr; pEVar13 = pEVar16,
              local_98.pos = local_98.ptr, pEVar9 != pEVar3; pEVar9 = pEVar9 + 1) {
            sVar11 = (pEVar9->key).content.size_;
            (pEVar16->key).content.ptr = (pEVar9->key).content.ptr;
            (pEVar16->key).content.size_ = sVar11;
            pTVar6 = (pEVar9->value).ptr;
            (pEVar16->value).disposer = (pEVar9->value).disposer;
            (pEVar16->value).ptr = pTVar6;
            (pEVar9->value).ptr = (TestVat *)0x0;
            pEVar16 = pEVar16 + 1;
          }
          for (; pEVar16 < pEVar13; pEVar13 = pEVar13 + -1) {
            kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>::~Own
                      (&pEVar13[-1].value);
          }
          local_98.pos = pEVar16;
          kj::
          ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
          ::dispose(this_01);
          (this->map).table.rows.builder.ptr = local_98.ptr;
          (this->map).table.rows.builder.pos = pEVar16;
          (this->map).table.rows.builder.endPtr = local_98.endPtr;
          (this->map).table.rows.builder.disposer = local_98.disposer;
          local_98.ptr = (Entry *)0x0;
          local_98.pos = (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
                          *)0x0;
          local_98.endPtr = (Entry *)0x0;
          kj::
          ArrayBuilder<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
          ::dispose(&local_98);
          pRVar15 = (this->map).table.rows.builder.pos;
        }
        (pRVar15->key).content.ptr = local_50.ptr;
        (pRVar15->key).content.size_ = local_50.size_;
        (pRVar15->value).disposer = local_40.disposer;
        (pRVar15->value).ptr = local_40.ptr;
        local_40.ptr = (TestVat *)0x0;
        pRVar15 = (this->map).table.rows.builder.pos;
        (this->map).table.rows.builder.pos = pRVar15 + 1;
        kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>::~Own(&local_40);
        pTVar6 = (pRVar15->value).ptr;
        kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>::~Own(&local_60);
        return pTVar6;
      }
      if (pHVar10->hash == uVar5) {
        bVar4 = kj::ArrayPtr<const_char>::operator==
                          ((ArrayPtr<const_char> *)(pEVar9 + (uVar2 - 2)),&local_50);
        if (bVar4) {
          kj::_::throwDuplicateTableRow();
        }
        sVar11 = (this->map).table.indexes.buckets.size_;
      }
    }
    sVar18 = (ulong)uVar17 + 1;
    uVar17 = (uint)sVar18;
    if (sVar18 == sVar11) {
      uVar17 = 0;
    }
  } while( true );
}

Assistant:

TestVat& TestNetwork::add(kj::StringPtr name) {
  return *map.insert(name, kj::heap<TestVat>(*this, name)).value;
}